

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci_heap.cpp
# Opt level: O3

FibHeap fib_heap_make(void)

{
  FibHeap p_Var1;
  
  p_Var1 = (FibHeap)operator_new(0x18);
  p_Var1->keyNum = 0;
  p_Var1->maxDegree = 0;
  p_Var1->min = (_FibonacciNode *)0x0;
  p_Var1->cons = (_FibonacciNode **)0x0;
  return p_Var1;
}

Assistant:

FibHeap fib_heap_make() {
    FibHeap heap;

    heap = new _FibonacciHeap();
    if (heap == NULL) {
        printf("Error: make FibHeap failed\n");
        return NULL;
    }

    heap->keyNum = 0;
    heap->maxDegree = 0;
    heap->min = NULL;
    heap->cons = NULL;

    return heap;
}